

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.h
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
ChebTools::ChebyshevCollection::solve_for_x
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,ChebyshevCollection *this
          ,double y)

{
  pointer pCVar1;
  pointer pdVar2;
  double *rt;
  pointer __args;
  pointer this_00;
  _Vector_base<double,_std::allocator<double>_> local_88;
  ChebyshevExpansion local_70;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar1 = (this->m_exps).
           super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_exps).
                 super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pCVar1; this_00 = this_00 + 1
      ) {
    ChebyshevExpansion::operator-(&local_70,this_00,y);
    ChebyshevExpansion::real_roots2
              ((vector<double,_std::allocator<double>_> *)&local_88,&local_70,true);
    ChebyshevExpansion::~ChebyshevExpansion(&local_70);
    pdVar2 = local_88._M_impl.super__Vector_impl_data._M_finish;
    for (__args = local_88._M_impl.super__Vector_impl_data._M_start; __args != pdVar2;
        __args = __args + 1) {
      std::vector<double,std::allocator<double>>::emplace_back<double&>
                ((vector<double,std::allocator<double>> *)__return_storage_ptr__,__args);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

auto solve_for_x(double y) const {
            std::vector<double> solns;
            for (auto& ex : m_exps) {
                bool only_in_domain = true;
                for (auto& rt : (ex - y).real_roots2(only_in_domain)) {
                    solns.emplace_back(rt);
                }
            }
            return solns;
        }